

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O0

bool arangodb::velocypack::Collection::any(Slice slice,Predicate *predicate)

{
  bool bVar1;
  Slice __args_1;
  Slice in_RDI;
  Slice s;
  ValueLength index;
  ArrayIterator it;
  ArrayIterator *in_stack_ffffffffffffffb8;
  ArrayIterator *this;
  ArrayIterator local_38;
  
  ArrayIterator::ArrayIterator(in_stack_ffffffffffffffb8,in_RDI);
  this = (ArrayIterator *)0x0;
  while( true ) {
    bVar1 = ArrayIterator::valid(&local_38);
    if (!bVar1) {
      return false;
    }
    __args_1 = ArrayIterator::value(this);
    bVar1 = std::function<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long)>::operator()
                      ((function<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long)> *)
                       in_RDI._start,&this->_slice,(unsigned_long)__args_1._start);
    if (bVar1) break;
    ArrayIterator::next((ArrayIterator *)in_RDI._start);
    this = (ArrayIterator *)((long)&(this->_slice)._start + 1);
  }
  return true;
}

Assistant:

bool Collection::any(Slice slice, Predicate const& predicate) {
  ArrayIterator it(slice);
  ValueLength index = 0;

  while (it.valid()) {
    Slice s = it.value();
    if (predicate(s, index)) {
      return true;
    }
    it.next();
    ++index;
  }

  return false;
}